

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_newslot(HSQUIRRELVM v,SQInteger idx,SQBool bstatic)

{
  SQObjectType SVar1;
  SQRESULT SVar2;
  SQObjectPtr *self;
  SQObjectPtr *key;
  SQObjectPtr *val;
  
  if (v->_top - v->_stackbase < 3) {
    SQVM::Raise_Error(v,"not enough params in the stack");
    SVar2 = -1;
  }
  else {
    if (idx < 0) {
      self = SQVM::GetUp(v,idx);
    }
    else {
      self = SQVM::GetAt(v,idx + v->_stackbase + -1);
    }
    SVar1 = (self->super_SQObject)._type;
    if ((SVar1 == OT_TABLE) || (SVar1 == OT_CLASS)) {
      key = SQVM::GetUp(v,-2);
      if ((key->super_SQObject)._type == OT_NULL) {
        sq_throwerror(v,"null is not a valid key");
        return -1;
      }
      val = SQVM::GetUp(v,-1);
      SQVM::NewSlot(v,self,key,val,bstatic != 0);
      SQVM::Pop(v,2);
    }
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

SQRESULT sq_newslot(HSQUIRRELVM v, SQInteger idx, SQBool bstatic)
{
    sq_aux_paramscheck(v, 3);
    SQObjectPtr &self = stack_get(v, idx);
    if(type(self) == OT_TABLE || type(self) == OT_CLASS) {
        SQObjectPtr &key = v->GetUp(-2);
        if(type(key) == OT_NULL) return sq_throwerror(v, _SC("null is not a valid key"));
        v->NewSlot(self, key, v->GetUp(-1),bstatic?true:false);
        v->Pop(2);
    }
    return SQ_OK;
}